

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O3

void __thiscall DBaseStatusBar::Destroy(DBaseStatusBar *this)

{
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 aVar1;
  size_t i;
  long lVar2;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 aVar3;
  
  lVar2 = 0;
  do {
    aVar1 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)this->Messages[lVar2].field_0.p;
    if ((aVar1 != (DHUDMessage *)0x0) && ((*(byte *)((long)aVar1 + 0x20) & 0x20) == 0)) {
      do {
        aVar3 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)((aVar1.p)->Next).field_0.p;
        if (aVar3.p == (DHUDMessage *)0x0) {
LAB_004cdd1b:
          aVar3.p = (DHUDMessage *)0x0;
        }
        else if ((((aVar3.p)->super_DObject).ObjectFlags & 0x20) != 0) {
          ((aVar1.p)->Next).field_0.p = (DHUDMessage *)0x0;
          goto LAB_004cdd1b;
        }
        (*((aVar1.p)->super_DObject)._vptr_DObject[4])();
        aVar1 = aVar3;
      } while (aVar3.p != (DHUDMessage *)0x0);
    }
    this->Messages[lVar2].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1)0x0;
    lVar2 = lVar2 + 1;
    if (lVar2 == 3) {
      DObject::Destroy(&this->super_DObject);
      return;
    }
  } while( true );
}

Assistant:

void DBaseStatusBar::Destroy ()
{
	for (size_t i = 0; i < countof(Messages); ++i)
	{
		DHUDMessage *msg = Messages[i];
		while (msg)
		{
			DHUDMessage *next = msg->Next;
			msg->Destroy();
			msg = next;
		}
		Messages[i] = NULL;
	}
	Super::Destroy();
}